

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_2e1d52a::ConstPubkeyProvider::GetPubKey
          (ConstPubkeyProvider *this,int pos,SigningProvider *arg,CPubKey *key,KeyOriginInfo *info,
          DescriptorCache *read_cache,DescriptorCache *write_cache)

{
  pointer puVar1;
  undefined1 *this_00;
  long in_FS_OFFSET;
  CKeyID local_34;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_PubkeyProvider).field_0xc;
  memcpy(key,this_00,0x41);
  puVar1 = (info->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((info->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (info->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  CPubKey::GetID(&local_34,(CPubKey *)this_00);
  *(undefined4 *)info->fingerprint =
       local_34.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool GetPubKey(int pos, const SigningProvider& arg, CPubKey& key, KeyOriginInfo& info, const DescriptorCache* read_cache = nullptr, DescriptorCache* write_cache = nullptr) const override
    {
        key = m_pubkey;
        info.path.clear();
        CKeyID keyid = m_pubkey.GetID();
        std::copy(keyid.begin(), keyid.begin() + sizeof(info.fingerprint), info.fingerprint);
        return true;
    }